

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudioVoice_DestroyVoice(FAudioVoice *voice)

{
  long *in_RDI;
  LinkedList **unaff_retaddr;
  FAudioBufferEntry *next;
  FAudioBufferEntry *entry;
  uint32_t i;
  FAudioVoice *in_stack_ffffffffffffffe0;
  FAudioFreeFunc in_stack_ffffffffffffffe8;
  FAudioVoice *pFVar1;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar2;
  
  FAudio_OPERATIONSET_ClearAllForVoice((FAudioVoice *)0x126e63);
  if (*(int *)((long)in_RDI + 0xc) == 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x126e83);
    while (in_RDI == *(long **)(*in_RDI + 0x88)) {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x126eaa);
      FAudio_PlatformLockMutex((FAudioMutex)0x126ebb);
    }
    LinkedList_RemoveEntry
              (unaff_retaddr,in_RDI,
               (FAudioMutex)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x126eff);
    pFVar1 = (FAudioVoice *)in_RDI[0x26];
    while (pFVar1 != (FAudioVoice *)0x0) {
      in_stack_ffffffffffffffe0 = (FAudioVoice *)pFVar1->sendFilter;
      (**(code **)(*in_RDI + 0xc0))(pFVar1);
      pFVar1 = in_stack_ffffffffffffffe0;
    }
    pFVar1 = (FAudioVoice *)in_RDI[0x27];
    while (pFVar1 != (FAudioVoice *)0x0) {
      in_stack_ffffffffffffffe0 = (FAudioVoice *)pFVar1->sendFilter;
      (**(code **)(*in_RDI + 0xc0))(pFVar1);
      pFVar1 = in_stack_ffffffffffffffe0;
    }
    (**(code **)(*in_RDI + 0xc0))(in_RDI[0x1f]);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x126fbf);
  }
  else if (*(int *)((long)in_RDI + 0xc) == 1) {
    LinkedList_RemoveEntry
              (unaff_retaddr,in_RDI,
               (FAudioMutex)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    (**(code **)(*in_RDI + 0xc0))(in_RDI[0x1a]);
  }
  else if (*(int *)((long)in_RDI + 0xc) == 2) {
    if (*(long *)(*in_RDI + 0xe0) != 0) {
      FAudio_PlatformQuit((void *)0x127053);
      *(undefined8 *)(*in_RDI + 0xe0) = 0;
    }
    if (in_RDI[0x1a] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[0x1a]);
    }
    *(undefined8 *)(*in_RDI + 0x10) = 0;
  }
  if (in_RDI[0x12] != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x1270ca);
    for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 2); uVar2 = uVar2 + 1) {
      (**(code **)(*in_RDI + 0xc0))(*(undefined8 *)(in_RDI[4] + (ulong)uVar2 * 8));
    }
    if (in_RDI[4] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[4]);
    }
    for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 2); uVar2 = uVar2 + 1) {
      (**(code **)(*in_RDI + 0xc0))(*(undefined8 *)(in_RDI[5] + (ulong)uVar2 * 8));
    }
    if (in_RDI[5] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[5]);
    }
    if (in_RDI[6] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[6]);
    }
    if (in_RDI[7] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[7]);
    }
    if (in_RDI[8] != 0) {
      for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 2); uVar2 = uVar2 + 1) {
        if (*(long *)(in_RDI[8] + (ulong)uVar2 * 8) != 0) {
          (**(code **)(*in_RDI + 0xc0))(*(undefined8 *)(in_RDI[8] + (ulong)uVar2 * 8));
        }
      }
      (**(code **)(*in_RDI + 0xc0))(in_RDI[8]);
    }
    if (*(long *)((long)in_RDI + 0x14) != 0) {
      (**(code **)(*in_RDI + 0xc0))(*(undefined8 *)((long)in_RDI + 0x14));
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1272a4);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1272b5);
  }
  if (in_RDI[0x13] != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x1272d5);
    FAudio_INTERNAL_FreeEffectChain(in_stack_ffffffffffffffe0);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1272f0);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x127301);
  }
  if (in_RDI[0x14] != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x127321);
    if (in_RDI[0x11] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[0x11]);
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12735e);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x12736f);
  }
  if (in_RDI[0x18] != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x12738f);
    if (in_RDI[0x16] != 0) {
      (**(code **)(*in_RDI + 0xc0))(in_RDI[0x16]);
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1273cc);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1273dd);
  }
  FAudio_Release((FAudio *)in_stack_ffffffffffffffe0);
  (**(code **)(*in_RDI + 0xc0))(in_RDI);
  return;
}

Assistant:

void FAudioVoice_DestroyVoice(FAudioVoice *voice)
{
	uint32_t i;
	LOG_API_ENTER(voice->audio)

	/* TODO: Check for dependencies and remove from audio graph first! */
	FAudio_OPERATIONSET_ClearAllForVoice(voice);

	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		FAudioBufferEntry *entry, *next;

#ifdef FAUDIO_DUMP_VOICES
		FAudio_DUMPVOICE_Finalize((FAudioSourceVoice*) voice);
#endif /* FAUDIO_DUMP_VOICES */

		FAudio_PlatformLockMutex(voice->audio->sourceLock);
		LOG_MUTEX_LOCK(voice->audio, voice->audio->sourceLock)
		while (voice == voice->audio->processingSource)
		{
			FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
			LOG_MUTEX_UNLOCK(voice->audio, voice->audio->sourceLock)
			FAudio_PlatformLockMutex(voice->audio->sourceLock);
			LOG_MUTEX_LOCK(voice->audio, voice->audio->sourceLock)
		}
		LinkedList_RemoveEntry(
			&voice->audio->sources,
			voice,
			voice->audio->sourceLock,
			voice->audio->pFree
		);
		FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->audio->sourceLock)

		entry = voice->src.bufferList;
		while (entry != NULL)
		{
			next = entry->next;
			voice->audio->pFree(entry);
			entry = next;
		}

		entry = voice->src.flushList;
		while (entry != NULL)
		{
			next = entry->next;
			voice->audio->pFree(entry);
			entry = next;
		}

		voice->audio->pFree(voice->src.format);
		LOG_MUTEX_DESTROY(voice->audio, voice->src.bufferLock)
		FAudio_PlatformDestroyMutex(voice->src.bufferLock);
#ifdef HAVE_WMADEC
		if (voice->src.wmadec)
		{
			FAudio_WMADEC_free(voice);
		}
#endif /* HAVE_WMADEC */
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		/* Remove submix from list */
		LinkedList_RemoveEntry(
			&voice->audio->submixes,
			voice,
			voice->audio->submixLock,
			voice->audio->pFree
		);

		/* Delete submix data */
		voice->audio->pFree(voice->mix.inputCache);
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		if (voice->audio->platform != NULL)
		{
			FAudio_PlatformQuit(voice->audio->platform);
			voice->audio->platform = NULL;
		}
		if (voice->master.effectCache != NULL)
		{
			voice->audio->pFree(voice->master.effectCache);
		}
		voice->audio->master = NULL;
	}

	if (voice->sendLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->sendLock);
		LOG_MUTEX_LOCK(voice->audio, voice->sendLock)
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			voice->audio->pFree(voice->sendCoefficients[i]);
		}
		if (voice->sendCoefficients != NULL)
		{
			voice->audio->pFree(voice->sendCoefficients);
		}
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			voice->audio->pFree(voice->mixCoefficients[i]);
		}
		if (voice->mixCoefficients != NULL)
		{
			voice->audio->pFree(voice->mixCoefficients);
		}
		if (voice->sendMix != NULL)
		{
			voice->audio->pFree(voice->sendMix);
		}
		if (voice->sendFilter != NULL)
		{
			voice->audio->pFree(voice->sendFilter);
		}
		if (voice->sendFilterState != NULL)
		{
			for (i = 0; i < voice->sends.SendCount; i += 1)
			{
				if (voice->sendFilterState[i] != NULL)
				{
					voice->audio->pFree(voice->sendFilterState[i]);
				}
			}
			voice->audio->pFree(voice->sendFilterState);
		}
		if (voice->sends.pSends != NULL)
		{
			voice->audio->pFree(voice->sends.pSends);
		}
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->sendLock)
		FAudio_PlatformDestroyMutex(voice->sendLock);
	}

	if (voice->effectLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->effectLock);
		LOG_MUTEX_LOCK(voice->audio, voice->effectLock)
		FAudio_INTERNAL_FreeEffectChain(voice);
		FAudio_PlatformUnlockMutex(voice->effectLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->effectLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->effectLock)
		FAudio_PlatformDestroyMutex(voice->effectLock);
	}

	if (voice->filterLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->filterLock);
		LOG_MUTEX_LOCK(voice->audio, voice->filterLock)
		if (voice->filterState != NULL)
		{
			voice->audio->pFree(voice->filterState);
		}
		FAudio_PlatformUnlockMutex(voice->filterLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->filterLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->filterLock)
		FAudio_PlatformDestroyMutex(voice->filterLock);
	}

	if (voice->volumeLock != NULL)
	{
		FAudio_PlatformLockMutex(voice->volumeLock);
		LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)
		if (voice->channelVolume != NULL)
		{
			voice->audio->pFree(voice->channelVolume);
		}
		FAudio_PlatformUnlockMutex(voice->volumeLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
		LOG_MUTEX_DESTROY(voice->audio, voice->volumeLock)
		FAudio_PlatformDestroyMutex(voice->volumeLock);
	}

	LOG_API_EXIT(voice->audio)
	FAudio_Release(voice->audio);
	voice->audio->pFree(voice);
}